

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v7::detail::
       parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                 (char *begin,char *end,
                 format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *handler)

{
  int id;
  undefined1 value [16];
  undefined1 value_00 [16];
  buffer_appender<char> out;
  buffer_appender<char> out_00;
  error_handler eVar1;
  error_handler *begin_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_01;
  ulong uVar2;
  char *begin_01;
  error_handler *this;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *__return_storage_ptr__;
  basic_format_specs<char> specs;
  format_arg arg;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  adapter;
  unkbyte10 in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff72;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_88;
  int local_78;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  buffer<char> *local_40;
  unsigned_long_long local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  begin_00 = (error_handler *)(begin + 1);
  if (begin_00 == (error_handler *)end) {
    error_handler::on_error((error_handler *)begin,"invalid format string");
  }
  if (*begin_00 == (error_handler)0x7b) {
    format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text(handler,(char *)begin_00,begin + 2);
    goto LAB_0019f760;
  }
  if (*begin_00 != (error_handler)0x7d) {
    local_68.arg_id = 0;
    this = begin_00;
    local_68.handler = handler;
    begin_00 = (error_handler *)
               parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
                         ((char *)begin_00,end,&local_68);
    if (begin_00 == (error_handler *)end) {
      eVar1 = (error_handler)0x0;
    }
    else {
      eVar1 = *begin_00;
    }
    if (eVar1 == (error_handler)0x3a) {
      begin_00 = (error_handler *)
                 format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 ::on_format_specs(handler,local_68.arg_id,(char *)(begin_00 + 1),end);
      if ((begin_00 == (error_handler *)end) || (*begin_00 != (error_handler)0x7d)) {
        error_handler::on_error((error_handler *)handler,"unknown format specifier");
      }
      goto LAB_0019f760;
    }
    if (eVar1 != (error_handler)0x7d) {
      error_handler::on_error(this,"missing \'}\' in format string");
    }
    __return_storage_ptr__ = &local_88;
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::get((format_arg *)&__return_storage_ptr__->string,&(handler->context).args_,local_68.arg_id);
    if (local_78 == 0) goto LAB_0019f77e;
    out_01.container =
         (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
         container;
    switch(local_78) {
    case 1:
      goto switchD_0019f528_caseD_1;
    case 2:
      goto switchD_0019f528_caseD_2;
    case 3:
      goto switchD_0019f528_caseD_3;
    case 4:
      goto switchD_0019f528_caseD_4;
    case 5:
      goto switchD_0019f528_caseD_5;
    case 6:
      goto switchD_0019f528_caseD_6;
    case 7:
      goto switchD_0019f528_caseD_7;
    case 8:
      goto switchD_0019f528_caseD_8;
    case 9:
      goto switchD_0019f528_caseD_9;
    case 10:
      goto switchD_0019f528_caseD_a;
    case 0xb:
      goto switchD_0019f528_caseD_b;
    case 0xc:
      goto switchD_0019f528_caseD_c;
    case 0xd:
      goto switchD_0019f528_caseD_d;
    case 0xe:
      goto switchD_0019f528_caseD_e;
    case 0xf:
      goto switchD_0019f528_caseD_f;
    }
    goto switchD_0019f528_default;
  }
  id = (handler->parse_context).next_arg_id_;
  if (id < 0) {
    error_handler::on_error
              ((error_handler *)begin,"cannot switch from manual to automatic argument indexing");
  }
  (handler->parse_context).next_arg_id_ = id + 1;
  __return_storage_ptr__ = &local_88;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  get((format_arg *)&__return_storage_ptr__->string,&(handler->context).args_,id);
  if (local_78 == 0) {
LAB_0019f77e:
    error_handler::on_error((error_handler *)&__return_storage_ptr__->string,"argument not found");
  }
  out_01.container =
       (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  switch(local_78) {
  case 1:
switchD_0019f528_caseD_1:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                   (out_01.container,local_88.int_value);
    break;
  case 2:
switchD_0019f528_caseD_2:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                   (out_01.container,local_88.uint_value);
    break;
  case 3:
switchD_0019f528_caseD_3:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
                   (out_01.container,CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
    break;
  case 4:
switchD_0019f528_caseD_4:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
                   (out_01.container,CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
    break;
  case 5:
switchD_0019f528_caseD_5:
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
         local_88.long_long_value._4_4_;
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
         local_88.int_value;
    value._10_6_ = in_stack_ffffffffffffff72;
    value._0_10_ = in_stack_ffffffffffffff68;
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
                   (out_01.container,out,(__int128)value);
    break;
  case 6:
switchD_0019f528_caseD_6:
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
         local_88.long_long_value._4_4_;
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
         local_88.int_value;
    value_00._10_6_ = in_stack_ffffffffffffff72;
    value_00._0_10_ = in_stack_ffffffffffffff68;
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
                   (out_01.container,out_00,(unsigned___int128)value_00);
    break;
  case 7:
switchD_0019f528_caseD_7:
    begin_01 = "false";
    if ((ulong)local_88.bool_value != 0) {
      begin_01 = "true";
    }
    uVar2 = (ulong)local_88.bool_value ^ 5;
    goto LAB_0019f717;
  case 8:
switchD_0019f528_caseD_8:
    out_01.container =
         (buffer<char> *)
         write<char,fmt::v7::detail::buffer_appender<char>>(out_01.container,local_88.char_value);
    break;
  case 9:
switchD_0019f528_caseD_9:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                   (out_01.container,local_88.float_value);
    break;
  case 10:
switchD_0019f528_caseD_a:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                   (out_01.container,
                    (double)CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
    break;
  case 0xb:
switchD_0019f528_caseD_b:
    specs.type = '\0';
    specs._9_1_ = 0;
    specs.fill.data_[0] = ' ';
    specs.fill.data_[1] = '\0';
    specs.fill.data_[2] = '\0';
    specs.fill.data_[3] = '\0';
    specs.fill.size_ = '\x01';
    specs._15_1_ = 0;
    specs.width = 0;
    specs.precision = -1;
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                   (out_01.container,
                    (longdouble)
                    CONCAT28(local_88.int128_value._8_2_,
                             CONCAT44(local_88.long_long_value._4_4_,local_88.int_value)),specs,
                    (locale_ref)0x0);
    break;
  case 0xc:
switchD_0019f528_caseD_c:
    out_01.container =
         (buffer<char> *)
         write<char,fmt::v7::detail::buffer_appender<char>>
                   (out_01.container,
                    (char *)CONCAT44(local_88.long_long_value._4_4_,local_88.int_value));
    break;
  case 0xd:
switchD_0019f528_caseD_d:
    begin_01 = (char *)CONCAT44(local_88.long_long_value._4_4_,local_88.int_value);
    uVar2 = CONCAT62(local_88.int128_value._10_6_,local_88.int128_value._8_2_);
LAB_0019f717:
    buffer<char>::append<char>(out_01.container,begin_01,begin_01 + uVar2);
    break;
  case 0xe:
switchD_0019f528_caseD_e:
    out_01.container =
         (buffer<char> *)
         write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
                   (out_01.container,CONCAT44(local_88.long_long_value._4_4_,local_88.int_value),
                    (basic_format_specs<char> *)0x0);
    break;
  case 0xf:
switchD_0019f528_caseD_f:
    local_38 = (handler->context).args_.desc_;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    local_30 = *(undefined4 *)&(handler->context).args_.field_1;
    uStack_2c = *(undefined4 *)((long)&(handler->context).args_.field_1 + 4);
    uStack_28 = *(undefined4 *)&(handler->context).loc_.locale_;
    uStack_24 = *(undefined4 *)((long)&(handler->context).loc_.locale_ + 4);
    local_40 = out_01.container;
    (*(code *)CONCAT62(local_88.int128_value._10_6_,local_88.int128_value._8_2_))
              (CONCAT44(local_88.long_long_value._4_4_,local_88.int_value),&local_58,&local_40);
    out_01.container = local_40;
  }
switchD_0019f528_default:
  (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       out_01.container;
LAB_0019f760:
  return (char *)(begin_00 + 1);
}

Assistant:

FMT_CONSTEXPR const Char* parse_replacement_field(const Char* begin,
                                                  const Char* end,
                                                  Handler&& handler) {
  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter<Handler, Char>{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}